

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_skip_list.c
# Opt level: O3

void test_skiplist_get_node_several(planck_unit_test_t *tc)

{
  planck_unit_result_t pVar1;
  int iVar2;
  ion_status_t iVar3;
  ion_sl_node_t *piVar4;
  long lVar5;
  int key;
  ion_byte_t buffer [10];
  ion_skiplist_t skiplist;
  int targets [50];
  uint local_140;
  char local_13a [10];
  ion_skiplist_t local_130;
  uint auStack_f8 [50];
  
  sl_initialize(&local_130,key_type_numeric_signed,4,10,7,1,4);
  local_130.super.compare = dictionary_compare_signed_value;
  lVar5 = 0;
  do {
    iVar2 = rand();
    local_140 = iVar2 % 1000;
    auStack_f8[lVar5] = local_140;
    sprintf(local_13a,"TEST %d");
    iVar3 = sl_insert(&local_130,&local_140,local_13a);
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(iVar3.error == '\0'),0x218,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar1 == '\0') goto LAB_0010236f;
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(iVar3.count == 1),0x219,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar1 == '\0') goto LAB_0010236f;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x32);
  lVar5 = 0;
  while( true ) {
    local_140 = auStack_f8[lVar5];
    piVar4 = sl_find_node(&local_130,&local_140);
    sprintf(local_13a,"TEST %d",(ulong)local_140);
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(*piVar4->key == local_140),0x225,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar1 == '\0') break;
    pVar1 = planck_unit_assert_str_are_equal
                      (tc,(char *)piVar4->value,local_13a,0x226,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                      );
    if (pVar1 == '\0') break;
    lVar5 = lVar5 + 1;
    if (lVar5 == 0x32) {
      sl_destroy(&local_130);
      return;
    }
  }
LAB_0010236f:
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_skiplist_get_node_several(
	planck_unit_test_t *tc
) {
	PRINT_HEADER();

	ion_skiplist_t skiplist;

	initialize_skiplist_std_conditions(&skiplist);

	int			targets[50];
	ion_byte_t	buffer[10];
	int			i;

	for (i = 0; i < 50; i++) {
		int key = rand() % 1000;

		targets[i] = key;
		sprintf((char *) buffer, "TEST %d", key);

		ion_status_t status = sl_insert(&skiplist, (ion_key_t) &key, buffer);

		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
	}

#if ION_DEBUG
	print_skiplist(&skip_list);
#endif

	for (i = 0; i < 50; i++) {
		int				key		= targets[i];
		ion_sl_node_t	*node	= sl_find_node(&skiplist, (ion_key_t) &key);

		sprintf((char *) buffer, "TEST %d", key);
		PLANCK_UNIT_ASSERT_TRUE(tc, *((int *) node->key) == key);
		PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) node->value, (char *) buffer);
	}

	sl_destroy(&skiplist);
}